

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglvertexarrayobject.cpp
# Opt level: O0

int __thiscall
QOpenGLVertexArrayObjectPrivate::bind
          (QOpenGLVertexArrayObjectPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_enum_32 aVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  GLuint array;
  undefined4 in_stack_fffffffffffffff0;
  
  aVar1 = this->vaoFuncsType;
  array = (GLuint)((ulong)this >> 0x20);
  if (aVar1 == Core_3_0) {
    QOpenGLFunctions_3_0::glBindVertexArray
              ((QOpenGLFunctions_3_0 *)CONCAT44(1,in_stack_fffffffffffffff0),array);
    iVar2 = extraout_EAX_00;
  }
  else if (aVar1 == Core_3_2) {
    QOpenGLFunctions_3_2_Core::glBindVertexArray
              ((QOpenGLFunctions_3_2_Core *)CONCAT44(2,in_stack_fffffffffffffff0),array);
    iVar2 = extraout_EAX;
  }
  else {
    iVar2 = aVar1 + ~OES;
    if (aVar1 - ARB < 3) {
      QOpenGLVertexArrayObjectHelper::glBindVertexArray
                ((QOpenGLVertexArrayObjectHelper *)CONCAT44(aVar1,in_stack_fffffffffffffff0),array);
      iVar2 = extraout_EAX_01;
    }
  }
  return iVar2;
}

Assistant:

void QOpenGLVertexArrayObjectPrivate::bind()
{
    switch (vaoFuncsType) {
#if !QT_CONFIG(opengles2)
    case Core_3_2:
        vaoFuncs.core_3_2->glBindVertexArray(vao);
        break;
    case Core_3_0:
        vaoFuncs.core_3_0->glBindVertexArray(vao);
        break;
#endif
    case ARB:
    case APPLE:
    case OES:
        vaoFuncs.helper->glBindVertexArray(vao);
        break;
    default:
        break;
    }
}